

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O0

void zFillRHS(trans_t trans,int nrhs,doublecomplex *x,int ldx,SuperMatrix *A,SuperMatrix *B)

{
  char local_6d;
  int local_6c;
  undefined1 auStack_68 [3];
  char transc [1];
  int ldc;
  doublecomplex zero;
  doublecomplex one;
  doublecomplex *rhs;
  DNformat *Bstore;
  SuperMatrix *B_local;
  SuperMatrix *A_local;
  int ldx_local;
  doublecomplex *x_local;
  int nrhs_local;
  trans_t trans_local;
  
  memset(auStack_68,0,0x10);
  local_6c = *B->Store;
  if (trans == NOTRANS) {
    local_6d = 'N';
  }
  else {
    local_6d = 'T';
  }
  sp_zgemm(&local_6d,"N",A->nrow,nrhs,A->ncol,(doublecomplex)ZEXT816(0x3ff0000000000000),A,x,ldx,
           _auStack_68,*(doublecomplex **)((long)B->Store + 8),local_6c);
  return;
}

Assistant:

void
zFillRHS(trans_t trans, int nrhs, doublecomplex *x, int ldx,
         SuperMatrix *A, SuperMatrix *B)
{
    DNformat *Bstore;
    doublecomplex   *rhs;
    doublecomplex one = {1.0, 0.0};
    doublecomplex zero = {0.0, 0.0};
    int      ldc;
    char transc[1];

    //Astore = A->Store;
    //Aval   = (doublecomplex *) Astore->nzval;
    Bstore = B->Store;
    rhs    = Bstore->nzval;
    ldc    = Bstore->lda;
    
    if ( trans == NOTRANS ) *(unsigned char *)transc = 'N';
    else *(unsigned char *)transc = 'T';

    sp_zgemm(transc, "N", A->nrow, nrhs, A->ncol, one, A,
	     x, ldx, zero, rhs, ldc);

}